

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2SharingTest::GLES2SharingTest
          (GLES2SharingTest *this,EglTestContext *eglTestCtx,char *name,char *desc,TestSpec *spec)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  deUint32 seed;
  
  egl::TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingTest_01dffef0;
  bVar1 = spec->destroyContextBFirst;
  bVar2 = spec->useResource;
  bVar3 = spec->destroyOnContexB;
  bVar4 = spec->initializeData;
  (this->m_spec).type = spec->type;
  (this->m_spec).destroyContextBFirst = bVar1;
  (this->m_spec).useResource = bVar2;
  (this->m_spec).destroyOnContexB = bVar3;
  (this->m_spec).initializeData = bVar4;
  bVar1 = spec->renderOnContexB;
  bVar2 = spec->verifyOnContexA;
  bVar3 = spec->verifyOnContexB;
  (this->m_spec).renderOnContexA = spec->renderOnContexA;
  (this->m_spec).renderOnContexB = bVar1;
  (this->m_spec).verifyOnContexA = bVar2;
  (this->m_spec).verifyOnContexB = bVar3;
  seed = deStringHash(name);
  deRandom_init(&(this->m_random).m_rnd,seed);
  this->m_log = eglTestCtx->m_testCtx->m_log;
  glw::Functions::Functions(&this->m_gl);
  return;
}

Assistant:

GLES2SharingTest::GLES2SharingTest (EglTestContext& eglTestCtx, const char* name , const char* desc, const TestSpec& spec)
	: TestCase	(eglTestCtx, name, desc)
	, m_spec	(spec)
	, m_random	(deStringHash(name))
	, m_log		(eglTestCtx.getTestContext().getLog())
{
}